

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>
::Matrix(Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>
         *this)

{
  Column_settings *colSettings;
  
  colSettings = (Column_settings *)operator_new(0x38);
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.sz = 0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  list.ptr = (char *)0x0;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x30;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (colSettings->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  this->colSettings_ = colSettings;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_false>_>_>
  ::RU_matrix(&this->matrix_,colSettings);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::Matrix()
    : colSettings_(new Column_settings()), matrix_(colSettings_)
{
  static_assert(
      PersistenceMatrixOptions::is_of_boundary_type || !PersistenceMatrixOptions::has_vine_update ||
          PersistenceMatrixOptions::has_column_pairings,
      "When no barcode is recorded with vine swaps, comparison functions for the columns have to be provided.");
  _assert_options();
}